

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  TestPartResult *this;
  TestInfo *in_RDX;
  char *in_RSI;
  ostream *in_RDI;
  string message;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  string kIndent;
  string kTestcase;
  TestResult *result;
  TestInfo *in_stack_fffffffffffffa38;
  TestPartResult *in_stack_fffffffffffffa40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa48;
  TestResult *in_stack_fffffffffffffa50;
  ostream *in_stack_fffffffffffffa60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffad4;
  undefined8 in_stack_fffffffffffffb18;
  undefined1 uVar8;
  ostream *poVar7;
  string *in_stack_fffffffffffffb20;
  string *indent;
  string *in_stack_fffffffffffffb28;
  string *in_stack_fffffffffffffb30;
  string *name;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  ostream *in_stack_fffffffffffffb40;
  allocator *ms;
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  TestPartResult *local_340;
  int local_338;
  int local_334;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [32];
  string local_2c0 [39];
  undefined1 local_299 [40];
  undefined1 local_271 [40];
  allocator local_249;
  string local_248 [36];
  undefined4 local_224;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  TestResult *local_20;
  TestInfo *local_18;
  char *local_10;
  ostream *local_8;
  
  uVar8 = (undefined1)((ulong)in_stack_fffffffffffffb18 >> 0x38);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = TestInfo::result(in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"testcase",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  Indent_abi_cxx11_((int)((ulong)in_stack_fffffffffffffa68 >> 0x20));
  poVar5 = local_8;
  Indent_abi_cxx11_((int)((ulong)in_stack_fffffffffffffa68 >> 0x20));
  poVar5 = std::operator<<(poVar5,local_98);
  std::operator<<(poVar5,"{\n");
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"name",&local_b9);
  pcVar6 = TestInfo::name((TestInfo *)0x1725be);
  ms = &local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,pcVar6,ms);
  OutputJsonKey(in_stack_fffffffffffffb40,
                (string *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                (bool)uVar8);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  pcVar6 = TestInfo::value_param(in_stack_fffffffffffffa38);
  if (pcVar6 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"value_param",&local_109);
    pcVar6 = TestInfo::value_param(in_stack_fffffffffffffa38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,pcVar6,&local_131);
    OutputJsonKey(in_stack_fffffffffffffb40,
                  (string *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                  in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                  (bool)uVar8);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  pcVar6 = TestInfo::type_param(in_stack_fffffffffffffa38);
  if (pcVar6 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"type_param",&local_159);
    pcVar6 = TestInfo::type_param(in_stack_fffffffffffffa38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,pcVar6,&local_181);
    OutputJsonKey(in_stack_fffffffffffffb40,
                  (string *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                  in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                  (bool)uVar8);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    poVar5 = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"status",&local_249);
    uVar1 = TestInfo::should_run(local_18);
    pcVar6 = "NOTRUN";
    if ((bool)uVar1) {
      pcVar6 = "RUN";
    }
    name = (string *)local_271;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_271 + 1),pcVar6,(allocator *)name);
    OutputJsonKey(poVar5,(string *)CONCAT17(uVar1,in_stack_fffffffffffffb38),name,(string *)pcVar6,
                  in_stack_fffffffffffffb20,(bool)uVar8);
    std::__cxx11::string::~string((string *)(local_271 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_271);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    indent = (string *)local_299;
    poVar7 = local_8;
    std::allocator<char>::allocator();
    uVar8 = (undefined1)((ulong)poVar7 >> 0x38);
    std::__cxx11::string::string((string *)(local_299 + 1),"time",(allocator *)indent);
    TestResult::elapsed_time(local_20);
    FormatTimeInMillisAsDuration_abi_cxx11_((TimeInMillis)ms);
    OutputJsonKey(poVar5,(string *)CONCAT17(uVar1,in_stack_fffffffffffffb38),name,(string *)pcVar6,
                  indent,(bool)uVar8);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::string::~string((string *)(local_299 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_299);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e0,"classname",&local_2e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_308,local_10,&local_309);
    OutputJsonKey(poVar5,(string *)CONCAT17(uVar1,in_stack_fffffffffffffb38),name,(string *)pcVar6,
                  indent,(bool)uVar8);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    poVar5 = local_8;
    TestPropertiesAsJson((TestResult *)pcVar6,indent);
    std::operator<<(poVar5,local_330);
    std::__cxx11::string::~string(local_330);
    local_334 = 0;
    for (local_338 = 0; iVar4 = local_338,
        iVar3 = TestResult::total_part_count((TestResult *)0x17315c), iVar4 < iVar3;
        local_338 = local_338 + 1) {
      this = TestResult::GetTestPartResult
                       (in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20));
      local_340 = this;
      bVar2 = TestPartResult::failed(this);
      in_stack_fffffffffffffad4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffad4);
      if (bVar2) {
        std::operator<<(local_8,",\n");
        local_334 = local_334 + 1;
        if (local_334 == 1) {
          poVar5 = std::operator<<(local_8,local_78);
          poVar5 = std::operator<<(poVar5,"\"");
          poVar5 = std::operator<<(poVar5,"failures");
          std::operator<<(poVar5,"\": [\n");
        }
        TestPartResult::file_name(in_stack_fffffffffffffa40);
        iVar4 = TestPartResult::line_number(local_340);
        FormatCompilerIndependentFileLocation_abi_cxx11_((char *)this,in_stack_fffffffffffffad4);
        std::operator+(in_stack_fffffffffffffa68,(char *)in_stack_fffffffffffffa60);
        TestPartResult::message((TestPartResult *)0x17346b);
        std::operator+(in_stack_fffffffffffffa48,(char *)in_stack_fffffffffffffa40);
        EscapeJson((string *)CONCAT44(iVar4,in_stack_fffffffffffffaa8));
        std::__cxx11::string::~string(local_3a0);
        std::__cxx11::string::~string(local_3c0);
        poVar5 = std::operator<<(local_8,local_78);
        poVar5 = std::operator<<(poVar5,"  {\n");
        poVar5 = std::operator<<(poVar5,local_78);
        poVar5 = std::operator<<(poVar5,"    \"failure\": \"");
        poVar5 = std::operator<<(poVar5,local_380);
        poVar5 = std::operator<<(poVar5,"\",\n");
        in_stack_fffffffffffffa68 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<(poVar5,local_78);
        in_stack_fffffffffffffa60 =
             std::operator<<((ostream *)in_stack_fffffffffffffa68,"    \"type\": \"\"\n");
        poVar5 = std::operator<<(in_stack_fffffffffffffa60,local_78);
        std::operator<<(poVar5,"  }");
        std::__cxx11::string::~string(local_380);
        std::__cxx11::string::~string(local_360);
      }
    }
    if (0 < local_334) {
      poVar5 = std::operator<<(local_8,"\n");
      poVar5 = std::operator<<(poVar5,local_78);
      std::operator<<(poVar5,"]");
    }
    iVar4 = (int)((ulong)in_stack_fffffffffffffa68 >> 0x20);
    poVar5 = std::operator<<(local_8,"\n");
    Indent_abi_cxx11_(iVar4);
    poVar5 = std::operator<<(poVar5,local_3e0);
    std::operator<<(poVar5,"}");
    std::__cxx11::string::~string(local_3e0);
    local_224 = 0;
  }
  else {
    std::allocator<char>::allocator();
    iVar4 = (int)((ulong)in_stack_fffffffffffffa68 >> 0x20);
    std::__cxx11::string::string(local_1a8,"file",&local_1a9);
    pcVar6 = TestInfo::file((TestInfo *)0x172b37);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,pcVar6,&local_1d1);
    OutputJsonKey(in_stack_fffffffffffffb40,
                  (string *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                  in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                  (bool)uVar8);
    iVar3 = (int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"line",&local_1f9);
    TestInfo::line(local_18);
    OutputJsonKey(in_stack_fffffffffffffb40,
                  (string *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                  in_stack_fffffffffffffb30,iVar3,in_stack_fffffffffffffb20,(bool)uVar8);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    poVar5 = std::operator<<(local_8,"\n");
    Indent_abi_cxx11_(iVar4);
    poVar5 = std::operator<<(poVar5,local_220);
    std::operator<<(poVar5,"}");
    std::__cxx11::string::~string(local_220);
    local_224 = 1;
  }
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_case_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestcase, "name", test_info.name(), kIndent);

  if (test_info.value_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "value_param",
                  test_info.value_param(), kIndent);
  }
  if (test_info.type_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestcase, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestcase, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestcase, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestcase, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestcase, "classname", test_case_name, kIndent, false);
  *stream << TestPropertiesAsJson(result, kIndent);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}